

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          string_view_type *key)

{
  byte bVar1;
  object *poVar2;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  _Var3;
  not_an_object *this_00;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_40;
  pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
  local_30;
  
  for (; bVar1 = (byte)*(object_storage *)this & 0xf, bVar1 == 9;
      this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)((long)this + 8))
  {
  }
  if (bVar1 == 0xd) {
    poVar2 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
             value_abi_cxx11_((object_storage *)this);
    _Var3._M_current =
         (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *)sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
            ::find(poVar2,key);
    poVar2 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
             value_abi_cxx11_((object_storage *)this);
    if (_Var3._M_current ==
        (poVar2->members_).
        super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_40.common_ = (common_storage)0x4;
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                (&local_30,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,key
                 ,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                  &local_40.common_);
      destroy((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_40.common_)
      ;
      _Var3._M_current = local_30.first.it_._M_current;
    }
  }
  else {
    if (bVar1 != 4) {
      this_00 = (not_an_object *)__cxa_allocate_exception(0x58);
      not_an_object::not_an_object<char>(this_00,key->_M_str,key->_M_len);
      __cxa_throw(this_00,&not_an_object::typeinfo,not_an_object::~not_an_object);
    }
    local_40.common_ = (common_storage)0x4;
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              (&local_30,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,key,
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_40.common_
              );
    destroy((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_40.common_);
    _Var3._M_current = local_30.first.it_._M_current;
  }
  return &(_Var3._M_current)->value_;
}

Assistant:

basic_json& operator[](const string_view_type& key)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object: 
                    return try_emplace(key, basic_json{}).first->value();
                case json_storage_kind::object:
                {           
                    auto it = cast<object_storage>().value().find(key);
                    if (it == cast<object_storage>().value().end())
                    {
                        return try_emplace(key, basic_json{}).first->value();
                    }
                    else
                    {
                        return (*it).value();
                    }
                    break;
                }
                case json_storage_kind::json_reference: 
                    return cast<json_reference_storage>().value()[key];
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }               
        }